

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O0

int i2d_PUBKEY(EVP_PKEY *a,uchar **pp)

{
  int iVar1;
  undefined1 local_50 [8];
  CBB cbb;
  uint8_t **outp_local;
  EVP_PKEY *pkey_local;
  
  if (a == (EVP_PKEY *)0x0) {
    pkey_local._4_4_ = 0;
  }
  else {
    cbb.u._24_8_ = pp;
    iVar1 = CBB_init((CBB *)local_50,0x80);
    if ((iVar1 != 0) && (iVar1 = EVP_marshal_public_key((CBB *)local_50,(EVP_PKEY *)a), iVar1 != 0))
    {
      iVar1 = CBB_finish_i2d((CBB *)local_50,(uint8_t **)cbb.u._24_8_);
      return iVar1;
    }
    CBB_cleanup((CBB *)local_50);
    pkey_local._4_4_ = -1;
  }
  return pkey_local._4_4_;
}

Assistant:

int i2d_PUBKEY(const EVP_PKEY *pkey, uint8_t **outp) {
  if (pkey == NULL) {
    return 0;
  }

  CBB cbb;
  if (!CBB_init(&cbb, 128) ||
      !EVP_marshal_public_key(&cbb, pkey)) {
    CBB_cleanup(&cbb);
    return -1;
  }
  return CBB_finish_i2d(&cbb, outp);
}